

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbcs.c
# Opt level: O2

void write_sbcs(charset_spec *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  pvVar1 = charset->data;
  uVar5 = 0xffffffffffffffff;
  uVar6 = *(uint *)((long)pvVar1 + 0x900);
  do {
    uVar4 = uVar6;
    if ((int)uVar4 <= (int)uVar5 + 1) {
      uVar3 = 0xffff;
      break;
    }
    uVar6 = (int)uVar5 + uVar4 >> 1;
    uVar3 = (ulong)*(byte *)((long)pvVar1 + (ulong)uVar6 + 0x800);
    uVar2 = *(ulong *)((long)pvVar1 + uVar3 * 8);
  } while (((ulong)input_chr < uVar2) ||
          (uVar5 = (ulong)uVar6, uVar6 = uVar4, uVar2 < (ulong)input_chr));
  (*emit)(emitctx,uVar3);
  return;
}

Assistant:

void write_sbcs(charset_spec const *charset, long int input_chr,
                charset_state *state,
                void (*emit)(void *ctx, long int output), void *emitctx)
{
    const struct sbcs_data *sd = charset->data;
    int i, j, k, c;

    UNUSEDARG(state);

    /*
     * Binary-search in the ucs2sbcs table.
     */
    i = -1;
    j = sd->nvalid;
    while (i+1 < j) {
        k = (i+j)/2;
        c = sd->ucs2sbcs[k];
        if (input_chr < sd->sbcs2ucs[c])
            j = k;
        else if (input_chr > sd->sbcs2ucs[c])
            i = k;
        else {
            emit(emitctx, c);
            return;
        }
    }
    emit(emitctx, ERROR);
}